

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_ManVectorAffinity(Gia_Man_t *p,Vec_Int_t *vSuper,Vec_Int_t *vDelay,word *Matrix,int nLimit)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int Levels [256];
  int local_460;
  uint local_44c;
  int aiStack_438 [258];
  
  uVar2 = vSuper->nSize;
  if ((int)uVar2 < 3) {
    __assert_fail("nSize > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                  ,0x366,
                  "int Str_ManVectorAffinity(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, word *, int)");
  }
  if (0x40 < uVar2) {
    memset(Matrix,0,0x200);
    return 0;
  }
  Gia_ManIncrementTravId(p);
  iVar9 = vSuper->nSize;
  if (iVar9 < 1) {
LAB_007d3744:
    iVar14 = 0;
LAB_007d3747:
    memset(Matrix + iVar14,0,(ulong)(0x3f - iVar14) * 8 + 8);
    if (iVar14 == 0) {
      if ((int)uVar2 <= iVar9) {
        vSuper->nSize = uVar2;
        return 0;
      }
      goto LAB_007d3939;
    }
  }
  else {
    piVar3 = vSuper->pArray;
    lVar8 = 0;
    do {
      if (piVar3[lVar8] < 0) goto LAB_007d389e;
      uVar11 = (uint)piVar3[lVar8] >> 1;
      if (p->nTravIdsAlloc <= (int)uVar11) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
      }
      p->pTravIds[uVar11] = p->nTravIds;
      if ((p->vCopies).nSize <= (int)uVar11) goto LAB_007d3860;
      (p->vCopies).pArray[uVar11] = (int)lVar8;
      Matrix[lVar8] = 0x8000000000000000 >> ((byte)lVar8 & 0x3f);
      aiStack_438[lVar8] = 0;
      lVar8 = lVar8 + 1;
      iVar9 = vSuper->nSize;
    } while (lVar8 < iVar9);
    if (iVar9 < 1) goto LAB_007d3744;
    local_460 = 1;
    uVar12 = 0;
    local_44c = uVar2;
LAB_007d3455:
    if (vSuper->pArray[uVar12] < 0) {
LAB_007d389e:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar11 = (uint)vSuper->pArray[uVar12] >> 1;
    if (p->nObjs <= (int)uVar11) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar6 = p->pObjs;
    pGVar1 = pGVar6 + uVar11;
    if ((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) {
      bVar4 = true;
      do {
        bVar5 = bVar4;
        pGVar6 = p->pObjs;
        if (bVar5) {
          if ((pGVar1 < pGVar6) || (pGVar6 + p->nObjs <= pGVar1)) goto LAB_007d3822;
          uVar11 = (uint)*(undefined8 *)pGVar1;
        }
        else {
          if ((pGVar1 < pGVar6) || (pGVar6 + p->nObjs <= pGVar1)) goto LAB_007d3822;
          uVar11 = *(uint *)&pGVar1->field_0x4;
        }
        uVar11 = (int)((ulong)((long)pGVar1 - (long)pGVar6) >> 2) * -0x55555555 -
                 (uVar11 & 0x1fffffff);
        if (p->nTravIdsAlloc <= (int)uVar11) goto LAB_007d387f;
        if (p->pTravIds[(int)uVar11] == p->nTravIds) {
          if ((int)uVar11 < 0) goto LAB_007d3841;
        }
        else {
          if (vSuper->nSize == nLimit) goto LAB_007d35c3;
          p->pTravIds[(int)uVar11] = p->nTravIds;
          iVar9 = vSuper->nSize;
          Matrix[iVar9] = 0;
          aiStack_438[iVar9] = local_460;
          if (((int)uVar11 < 0) || ((p->vCopies).nSize <= (int)uVar11)) goto LAB_007d3860;
          (p->vCopies).pArray[uVar11] = iVar9;
          Vec_IntPush(vSuper,uVar11 * 2);
        }
        if ((p->vCopies).nSize <= (int)uVar11) goto LAB_007d3841;
        Matrix[(p->vCopies).pArray[uVar11]] = Matrix[(p->vCopies).pArray[uVar11]] | Matrix[uVar12];
        bVar4 = false;
      } while (bVar5);
      pGVar6 = p->pObjs;
    }
LAB_007d35c3:
    if ((pGVar1 < pGVar6) || (pGVar6 + p->nObjs <= pGVar1)) {
LAB_007d3822:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if ((p->pMuxes == (uint *)0x0) ||
       (uVar11 = p->pMuxes[(int)((ulong)((long)pGVar1 - (long)pGVar6) >> 2) * -0x55555555],
       uVar11 == 0)) goto LAB_007d36b0;
    if ((int)uVar11 < 0) goto LAB_007d389e;
    uVar7 = uVar11 >> 1;
    if (p->nTravIdsAlloc <= (int)uVar7) {
LAB_007d387f:
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[uVar7] == p->nTravIds) {
LAB_007d3690:
      if ((p->vCopies).nSize <= (int)uVar7) {
LAB_007d3841:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Matrix[(p->vCopies).pArray[uVar7]] = Matrix[(p->vCopies).pArray[uVar7]] | Matrix[uVar12];
LAB_007d36b0:
      uVar11 = vSuper->nSize;
      uVar10 = (ulong)uVar11;
      if (((uVar12 == local_44c) && (local_460 = local_460 + 1, local_44c = uVar11, local_460 == 8))
         || (uVar12 = uVar12 + 1, (long)(int)uVar11 <= (long)uVar12)) goto LAB_007d36de;
      goto LAB_007d3455;
    }
    if (vSuper->nSize != nLimit) {
      p->pTravIds[uVar7] = p->nTravIds;
      iVar9 = vSuper->nSize;
      Matrix[iVar9] = 0;
      aiStack_438[iVar9] = local_460;
      if ((p->vCopies).nSize <= (int)uVar7) {
LAB_007d3860:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[uVar7] = iVar9;
      Vec_IntPush(vSuper,uVar11 & 0x7ffffffe);
      goto LAB_007d3690;
    }
    uVar10 = (ulong)(uint)nLimit;
LAB_007d36de:
    iVar9 = (int)uVar10;
    if (iVar9 < 1) goto LAB_007d3744;
    uVar12 = 0;
    iVar14 = 0;
    do {
      uVar13 = Matrix[uVar12];
      if (uVar13 == 0) {
        __assert_fail("Matrix[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                      ,0x3a5,
                      "int Str_ManVectorAffinity(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, word *, int)"
                     );
      }
      if (((uVar13 & uVar13 - 1) != 0) && (uVar13 != -1L << (-(char)uVar2 & 0x3fU))) {
        Matrix[iVar14] = uVar13;
        aiStack_438[iVar14] = aiStack_438[uVar12];
        iVar14 = iVar14 + 1;
        if (iVar14 == 0x40) {
          iVar14 = 0x40;
          goto LAB_007d3768;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
    if (iVar14 < 0x40) goto LAB_007d3747;
  }
LAB_007d3768:
  uVar12 = 0xffffffff;
  uVar11 = 0x20;
  do {
    uVar7 = 0;
    do {
      uVar10 = Matrix[(int)(uVar7 + uVar11)];
      uVar13 = (uVar10 >> (sbyte)uVar11 ^ Matrix[(int)uVar7]) & uVar12;
      Matrix[(int)uVar7] = Matrix[(int)uVar7] ^ uVar13;
      Matrix[(int)(uVar7 + uVar11)] = uVar13 << (sbyte)uVar11 ^ uVar10;
      uVar7 = uVar7 + uVar11 + 1 & ~uVar11;
    } while ((int)uVar7 < 0x40);
    uVar12 = uVar12 ^ uVar12 << (sbyte)(uVar11 >> 1);
    bVar4 = 1 < uVar11;
    uVar11 = uVar11 >> 1;
  } while (bVar4);
  if ((int)uVar2 <= iVar9) {
    vSuper->nSize = uVar2;
    return iVar14;
  }
LAB_007d3939:
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Str_ManVectorAffinity( Gia_Man_t * p, Vec_Int_t * vSuper, Vec_Int_t * vDelay, word Matrix[256], int nLimit )
{
    int fVerbose = 0;
    int Levels[256];
    int nSize = Vec_IntSize(vSuper);
    int Prev = nSize, nLevels = 1;
    int i, k, iLit, iFanin, nSizeNew;
    word Mask; 
    assert( nSize > 2 );
    if ( nSize > 64 )
    {
        for ( i = 0; i < 64; i++ )
            Matrix[i] = 0;
        return 0;
    }
    // mark current nodes
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        Gia_ObjSetTravIdCurrentId( p, Abc_Lit2Var(iLit) );
        Str_ManSetNum( p, Abc_Lit2Var(iLit), i );
        Matrix[i] = ((word)1) << (63-i);
        Levels[i] = 0;
    }
    // collect 64 nodes
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            for ( k = 0; k < 2; k++ )
            {
                iFanin = k ? Gia_ObjFaninId1p(p, pObj) : Gia_ObjFaninId0p(p, pObj);
                if ( !Gia_ObjIsTravIdCurrentId(p, iFanin) )
                {
                    if ( Vec_IntSize(vSuper) == nLimit )
                        break;
                    Gia_ObjSetTravIdCurrentId( p, iFanin );
                    Matrix[Vec_IntSize(vSuper)] = 0;
                    Levels[Vec_IntSize(vSuper)] = nLevels;
                    Str_ManSetNum( p, iFanin, Vec_IntSize(vSuper) );
                    Vec_IntPush( vSuper, Abc_Var2Lit(iFanin, 0) );
                }
                Matrix[Str_ManNum(p, iFanin)] |= Matrix[i];
            }
        }
        if ( Gia_ObjIsMux(p, pObj) )
        {
            iFanin = Gia_ObjFaninId2p(p, pObj);
            if ( !Gia_ObjIsTravIdCurrentId(p, iFanin) )
            {
                if ( Vec_IntSize(vSuper) == nLimit )
                    break;
                Gia_ObjSetTravIdCurrentId( p, iFanin );
                Matrix[Vec_IntSize(vSuper)] = 0;
                Levels[Vec_IntSize(vSuper)] = nLevels;
                Str_ManSetNum( p, iFanin, Vec_IntSize(vSuper) );
                Vec_IntPush( vSuper, Abc_Var2Lit(iFanin, 0) );
            }
            Matrix[Str_ManNum(p, iFanin)] |= Matrix[i];
        }
        if ( Prev == i )
            Prev = Vec_IntSize(vSuper), nLevels++;
        if ( nLevels == 8 )
            break;
    }

    // remove those that have all 1s or only one 1
    Mask = (~(word)0) << (64 - nSize);
    for ( k = i = 0; i < Vec_IntSize(vSuper); i++ )
    {
        assert( Matrix[i] );
        if ( (Matrix[i] & (Matrix[i] - 1)) == 0 )
            continue;
        if ( Matrix[i] == Mask )
            continue;
        Matrix[k] = Matrix[i];
        Levels[k] = Levels[i];
        k++;
        if ( k == 64 )
            break;
    }
    // clean the remaining ones
    for ( i = k; i < 64; i++ )
        Matrix[i] = 0;
    nSizeNew = k;
    if ( nSizeNew == 0 )
    {
        Vec_IntShrink( vSuper, nSize );
        return 0;
    }
/*
    // report
    if ( fVerbose && nSize > 20 )
    {
        for ( i = 0; i < nSizeNew; i++ )
            Extra_PrintBinary( stdout, Matrix+i, 64 ), printf( "\n" );
        printf( "\n" );
    }
*/
    transpose64( Matrix );

    // report
    if ( fVerbose && nSize > 10 )
    {
        printf( "Gate inputs = %d.  Collected fanins = %d.  All = %d.  Good = %d.  Levels = %d\n", 
            nSize, Vec_IntSize(vSuper) - nSize, Vec_IntSize(vSuper), nSizeNew, nLevels );
        printf( "                     " );
        for ( i = 0; i < nSizeNew; i++ )
            printf( "%d", Levels[i] );
        printf( "\n" );
        for ( i = 0; i < nSize; i++ )
        {
            printf( "%6d : ", Abc_Lit2Var(Vec_IntEntry(vSuper, i)) );
            printf( "%3d   ", Vec_IntEntry(vDelay, i) >> 4 );
            printf( "%3d   ", Vec_IntEntry(vDelay, i) & 15 );
//            Extra_PrintBinary( stdout, Matrix+i, 64 ), printf( "\n" );
        }
        i = 0;
    }
    Vec_IntShrink( vSuper, nSize );
    return nSizeNew;
}